

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatcher.cpp
# Opt level: O3

void __thiscall cppnet::Dispatcher::~Dispatcher(Dispatcher *this)

{
  _Atomic_word *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  int iVar3;
  pthread_t pVar4;
  
  (this->super_Thread)._vptr_Thread = (_func_int **)&PTR__Dispatcher_00124fd8;
  pVar4 = pthread_self();
  if (pVar4 != (this->_local_thread_id)._M_thread) {
    LOCK();
    (this->super_Thread)._stop._M_base._M_i = true;
    UNLOCK();
    (*((this->_event_actions).super___shared_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr)->_vptr_EventActions[0xb])();
    (*(this->super_Thread)._vptr_Thread[4])(this);
  }
  p_Var2 = (this->_cppnet_base).super___weak_ptr<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var2->_M_weak_count;
      iVar3 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar3 = p_Var2->_M_weak_count;
      p_Var2->_M_weak_count = iVar3 + -1;
    }
    if (iVar3 == 1) {
      (*p_Var2->_vptr__Sp_counted_base[3])();
    }
  }
  p_Var2 = (this->_event_actions).
           super___shared_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  p_Var2 = (this->_timer).super___shared_ptr<cppnet::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~vector
            (&this->_task_list);
  p_Var2 = (this->super_enable_shared_from_this<cppnet::Dispatcher>)._M_weak_this.
           super___weak_ptr<cppnet::Dispatcher,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var2->_M_weak_count;
      iVar3 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar3 = p_Var2->_M_weak_count;
      p_Var2->_M_weak_count = iVar3 + -1;
    }
    if (iVar3 == 1) {
      (*p_Var2->_vptr__Sp_counted_base[3])();
    }
  }
  Thread::~Thread(&this->super_Thread);
  return;
}

Assistant:

Dispatcher::~Dispatcher() {
    if (std::this_thread::get_id() != _local_thread_id) {
        Stop();
        Join();
    }
}